

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Optional<unsigned_long> Corrade::Utility::Path::size(StringView filename)

{
  StringView value;
  StringView value_00;
  StringView value_01;
  bool bVar1;
  int fd;
  char *__filename;
  FILE *handle;
  Debug *pDVar2;
  int *piVar3;
  size_t in_RCX;
  char *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  anon_union_8_1_49ece5b0_for_Optional<unsigned_long>_1 this;
  Optional<unsigned_long> OVar5;
  StringView view;
  Flags local_141;
  Error local_140;
  undefined1 local_111;
  undefined4 local_110;
  FILE *local_108;
  char *pcStack_100;
  Flags local_f1;
  Error local_f0;
  undefined1 local_c8 [8];
  ScopeGuard exit;
  Flags local_91;
  undefined1 local_90 [8];
  Error err;
  String local_40;
  FILE *local_28;
  FILE *f;
  StringView filename_local;
  Optional<unsigned_long> *size_;
  
  f = (FILE *)filename._sizePlusFlags;
  this._value = (unsigned_long)filename._data;
  view._sizePlusFlags = in_RCX;
  view._data = in_RDX;
  filename_local._data = in_RDX;
  filename_local._sizePlusFlags = this._value;
  Containers::String::nullTerminatedView(&local_40,(String *)f,view);
  __filename = Containers::String::data(&local_40);
  handle = fopen(__filename,"rb");
  Containers::String::~String(&local_40);
  local_28 = handle;
  if (handle == (FILE *)0x0) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_91);
    Error::Error((Error *)local_90,local_91);
    pDVar2 = Debug::operator<<((Debug *)local_90,"Utility::Path::size(): can\'t open");
    value_01._sizePlusFlags = (size_t)filename_local._data;
    value_01._data = (char *)f;
    pDVar2 = Debug::operator<<(pDVar2,value_01);
    pDVar2 = Debug::operator<<(pDVar2,Debug::nospace);
    Debug::operator<<(pDVar2,":");
    piVar3 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)local_90,*piVar3);
    Containers::Optional<unsigned_long>::Optional((Optional<unsigned_long> *)this._value);
    Error::~Error((Error *)local_90);
    uVar4 = extraout_RDX;
  }
  else {
    Containers::ScopeGuard::ScopeGuard<_IO_FILE*,int(*)(_IO_FILE*)>
              ((ScopeGuard *)local_c8,(_IO_FILE *)handle,fclose);
    fd = fileno(local_28);
    bVar1 = anon_unknown_25::isDirectory(fd);
    if (bVar1) {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_f1);
      Error::Error(&local_f0,local_f1);
      pDVar2 = Debug::operator<<(&local_f0.super_Debug,"Utility::Path::size():");
      local_108 = f;
      pcStack_100 = filename_local._data;
      value_00._sizePlusFlags = (size_t)filename_local._data;
      value_00._data = (char *)f;
      pDVar2 = Debug::operator<<(pDVar2,value_00);
      Debug::operator<<(pDVar2,"is a directory");
      Error::~Error(&local_f0);
      Containers::Optional<unsigned_long>::Optional((Optional<unsigned_long> *)this._value);
    }
    else {
      local_111 = 0;
      anon_unknown_25::size((anon_unknown_25 *)this,(FILE *)local_28);
      bVar1 = Containers::Optional::operator_cast_to_bool((Optional *)this);
      if (!bVar1) {
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_141);
        Error::Error(&local_140,local_141);
        pDVar2 = Debug::operator<<(&local_140.super_Debug,"Utility::Path::size():");
        value._sizePlusFlags = (size_t)filename_local._data;
        value._data = (char *)f;
        pDVar2 = Debug::operator<<(pDVar2,value);
        Debug::operator<<(pDVar2,"is not seekable");
        Error::~Error(&local_140);
      }
      local_111 = 1;
    }
    local_110 = 1;
    Containers::ScopeGuard::~ScopeGuard((ScopeGuard *)local_c8);
    uVar4 = extraout_RDX_00;
  }
  OVar5._8_8_ = uVar4;
  OVar5.field_0._value = this._value;
  return OVar5;
}

Assistant:

Containers::Optional<std::size_t> size(const Containers::StringView filename) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "rb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"rb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::size(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    Containers::ScopeGuard exit{f, std::fclose};

    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    /* Explicitly fail if opening directories for reading on Unix to prevent
       silent errors, see isDirectory(int) for details. On Windows the fopen()
       fails already. */
    if(isDirectory(fileno(f))) {
        Error{} << "Utility::Path::size():" << filename << "is a directory";
        return {};
    }
    #endif

    Containers::Optional<std::size_t> size_ = size(f);
    if(!size_)
        Error{} << "Utility::Path::size():" << filename << "is not seekable";
    return size_;
}